

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeForce::ChLoadXYZnodeForce
          (ChLoadXYZnodeForce *this,shared_ptr<chrono::ChNodeXYZ> *body)

{
  double dVar1;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChNodeXYZ,void>
            (local_20,&body->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadCustom::ChLoadCustom(&this->super_ChLoadCustom,(shared_ptr<chrono::ChLoadable> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustom_0116d338;
  (this->computed_abs_force).m_data[2] = 0.0;
  (this->computed_abs_force).m_data[0] = 0.0;
  (this->computed_abs_force).m_data[1] = 0.0;
  dVar1 = DAT_011dd3e0;
  if (this != (ChLoadXYZnodeForce *)(Q_FLIP_AROUND_X + 8)) {
    (this->computed_abs_force).m_data[0] = VNULL;
    (this->computed_abs_force).m_data[1] = dVar1;
    (this->computed_abs_force).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

ChLoadXYZnodeForce::ChLoadXYZnodeForce(std::shared_ptr<ChNodeXYZ> body)
    : ChLoadCustom(body)
{
	computed_abs_force = VNULL;
}